

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

bool __thiscall
Memory::LargeHeapBlock::TestObjectMarkedBit(LargeHeapBlock *this,void *objectAddress)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  LargeObjectHeader *local_28;
  
  BVar3 = IsValidObject(this,objectAddress);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x32a,"(IsValidObject(objectAddress))","IsValidObject(objectAddress)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = GetObjectHeader(this,objectAddress,&local_28);
  if (bVar2) {
    bVar2 = HeapBlockMap64::IsMarked(&this->heapInfo->recycler->heapBlockMap,objectAddress);
    return bVar2;
  }
  return false;
}

Assistant:

bool
LargeHeapBlock::TestObjectMarkedBit(void* objectAddress)
{
    Assert(IsValidObject(objectAddress));

    LargeObjectHeader* pHeader = nullptr;

    if (GetObjectHeader(objectAddress, &pHeader))
    {
        Recycler* recycler = this->heapInfo->recycler;

        return recycler->heapBlockMap.IsMarked(objectAddress);
    }

    return FALSE;
}